

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

int bf_write(bfile_t *bfile,uint8_t *buffer,uint len)

{
  ulong uVar1;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  size_t cpylen;
  size_t bufoff;
  size_t towrite;
  size_t haswritten;
  size_t local_40;
  bfile_t *in_stack_ffffffffffffffd0;
  ulong local_20;
  
  local_20 = 0;
  uVar1 = (ulong)in_EDX;
  while (local_20 < uVar1) {
    if ((ulong)(*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x20)) <
        (ulong)*(uint *)(in_RDI + 0x38)) {
      in_stack_ffffffffffffffd0 =
           (bfile_t *)(*(ulong *)(in_RDI + 0x18) % (ulong)*(uint *)(in_RDI + 0x38));
      if ((ulong)*(uint *)(in_RDI + 0x38) - (long)in_stack_ffffffffffffffd0 < uVar1 - local_20) {
        local_40 = (ulong)*(uint *)(in_RDI + 0x38) - (long)in_stack_ffffffffffffffd0;
      }
      else {
        local_40 = uVar1 - local_20;
      }
      memcpy((void *)((long)&in_stack_ffffffffffffffd0->flags + *(long *)(in_RDI + 0x30)),
             (void *)(in_RSI + local_20),local_40);
      local_20 = local_40 + local_20;
      *(size_t *)(in_RDI + 0x18) = local_40 + *(long *)(in_RDI + 0x18);
    }
    else {
      bf_write_buffer(in_stack_ffffffffffffffd0);
    }
  }
  return (int)local_20;
}

Assistant:

int
bf_write(
    bfile_t * bfile,
    uint8_t * buffer,
    unsigned int len )
{
    size_t haswritten, towrite;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_WRITABLE) != FALSE );

    haswritten = 0;
    towrite = len;
    while ( haswritten < towrite ) {
        if ( (bfile->pos - bfile->ipos) < bfile->buffer_size ) {
            size_t bufoff, cpylen;
            bufoff = bfile->pos % bfile->buffer_size;
            cpylen = PRF_MIN( (bfile->buffer_size - bufoff), (towrite - haswritten) );
            memcpy( bfile->buffer + bufoff, buffer + haswritten, cpylen );
            haswritten += cpylen;
            bfile->pos += cpylen;
        } else {
            bf_write_buffer( bfile );
        }
    }

    return (int)haswritten;
}